

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O2

bool __thiscall wasm::needsQuoting(wasm *this,Name name)

{
  string *__return_storage_ptr__;
  basic_string_view<char,_std::char_traits<char>_> __y;
  bool bVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  char *local_68;
  string mangled;
  undefined1 local_28 [8];
  Name name_local;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_len;
  __return_storage_ptr__ = (string *)((long)&mangled.field_2 + 8);
  local_28 = (undefined1  [8])this;
  IString::toString_abi_cxx11_(__return_storage_ptr__,(IString *)local_28);
  ::wasm::asmangle(&local_68,__return_storage_ptr__);
  std::__cxx11::string::~string((string *)(mangled.field_2._M_local_buf + 8));
  __y._M_str = (char *)name_local.super_IString.str._M_len;
  __y._M_len = (size_t)local_28;
  __x._M_str = local_68;
  __x._M_len = (size_t)mangled._M_dataplus._M_p;
  bVar1 = std::operator!=(__x,__y);
  std::__cxx11::string::~string((string *)&local_68);
  return bVar1;
}

Assistant:

static bool needsQuoting(Name name) {
  auto mangled = asmangle(name.toString());
  return mangled != name.str;
}